

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HMAC.c
# Opt level: O0

void EverCrypt_HMAC_compute_sha2_512
               (uint8_t *dst,uint8_t *key,uint32_t key_len,uint8_t *data,uint32_t data_len)

{
  FStar_UInt128_uint128 *pFVar1;
  uint8_t *b;
  uint64_t extraout_RDX;
  uint8_t *b_00;
  uint64_t extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  uint8_t *b_01;
  uint64_t x_00;
  uint8_t *puVar2;
  undefined1 in_stack_fffffffffffffa78 [16];
  undefined1 in_stack_fffffffffffffa88 [16];
  uint8_t auStack_508 [120];
  undefined8 uStack_490;
  uint8_t auStack_488 [136];
  uint64_t local_400;
  FStar_UInt128_uint128 *local_3f8;
  undefined8 local_3f0;
  FStar_UInt128_uint128 *local_3e8;
  uint64_t local_3e0;
  FStar_UInt128_uint128 *local_3d8;
  FStar_UInt128_uint128 *local_3c8;
  FStar_UInt128_uint128 *local_3b8;
  uint8_t *local_3b0;
  uint8_t *local_3a8;
  uint8_t *local_3a0;
  FStar_UInt128_uint128 *local_398;
  uint8_t *local_390;
  FStar_UInt128_uint128 *local_388;
  uint8_t *local_380;
  FStar_UInt128_uint128 *local_378;
  undefined8 local_370;
  FStar_UInt128_uint128 *local_368;
  undefined8 local_360;
  FStar_UInt128_uint128 *local_358;
  undefined8 local_350;
  FStar_UInt128_uint128 *local_348;
  FStar_UInt128_uint128 *local_338;
  undefined8 local_330;
  FStar_UInt128_uint128 *local_328;
  uint64_t local_320;
  FStar_UInt128_uint128 *local_318;
  undefined8 local_310;
  FStar_UInt128_uint128 *local_308;
  uint8_t *local_2f8;
  uint8_t *rem;
  uint8_t *full_blocks;
  uint local_2e0;
  uint32_t full_blocks_len;
  uint32_t rem_len;
  uint32_t n_blocks;
  undefined4 uStack_2c4;
  uint32_t n_blocks__1;
  K___uint32_t_uint32_t scrut;
  uint32_t rem0;
  uint32_t n_blocks0;
  uint32_t block_len;
  uint8_t *hash1;
  uint8_t *rem_1;
  uint8_t *full_blocks_1;
  uint32_t full_blocks_len_1;
  uint32_t rem_len_1;
  uint32_t n_blocks_1;
  uint uStack_1cc;
  uint32_t n_blocks_;
  K___uint32_t_uint32_t scrut_1;
  uint32_t rem0_1;
  uint32_t n_blocks0_1;
  uint32_t block_len_1;
  uint8_t *dst1;
  uint64_t *s;
  uint64_t x_7;
  uint64_t *os_7;
  uint64_t x_6;
  uint64_t *os_6;
  uint64_t x_5;
  uint64_t *os_5;
  uint64_t x_4;
  uint64_t *os_4;
  uint64_t x_3;
  uint64_t *os_3;
  uint64_t x_2;
  uint64_t *os_2;
  uint64_t x_1;
  uint64_t *os_1;
  uint64_t x;
  uint64_t *os;
  uint64_t local_b8;
  uint32_t i_2;
  uint64_t st [8];
  uint8_t yi_1;
  uint8_t xi_1;
  uint32_t i_1;
  unsigned_long __vla_expr2;
  uint8_t yi;
  uint8_t xi;
  uint32_t i;
  unsigned_long __vla_expr1;
  uint8_t *zeroes;
  uint32_t ite;
  uint8_t *nkey;
  unsigned_long __vla_expr0;
  uint32_t l;
  uint32_t data_len_local;
  uint8_t *data_local;
  uint32_t key_len_local;
  uint8_t *key_local;
  uint8_t *dst_local;
  
  local_3a0 = auStack_488;
  uStack_490 = 0x29150d;
  memset(local_3a0,0,0x80);
  if (key_len < 0x81) {
    uStack_490 = 0x291560;
    memcpy(local_3a0,key,(ulong)key_len);
  }
  else {
    uStack_490 = 0x291572;
    Hacl_Hash_SHA2_hash_512(local_3a0,key,key_len);
  }
  local_3a8 = auStack_508;
  memset(local_3a8,0x36,0x80);
  for (__vla_expr2._4_4_ = 0; __vla_expr2._4_4_ < 0x80; __vla_expr2._4_4_ = __vla_expr2._4_4_ + 1) {
    local_3a8[__vla_expr2._4_4_] = local_3a8[__vla_expr2._4_4_] ^ local_3a0[__vla_expr2._4_4_];
  }
  local_3b0 = &stack0xfffffffffffffa78;
  memset(local_3b0,0x5c,0x80);
  for (st[7]._4_4_ = 0; st[7]._4_4_ < 0x80; st[7]._4_4_ = st[7]._4_4_ + 1) {
    st[7]._3_1_ = local_3b0[st[7]._4_4_];
    st[7]._2_1_ = local_3a0[st[7]._4_4_];
    local_3b0[st[7]._4_4_] = st[7]._3_1_ ^ st[7]._2_1_;
  }
  x_00 = 0;
  memset(&stack0xffffffffffffff48,0,0x40);
  puVar2 = local_3a8;
  local_b8 = 0x6a09e667f3bcc908;
  st[0] = 0xbb67ae8584caa73b;
  st[1] = 0x3c6ef372fe94f82b;
  st[2] = 0xa54ff53a5f1d36f1;
  st[3] = 0x510e527fade682d1;
  st[4] = 0x9b05688c2b3e6c1f;
  st[5] = 0x1f83d9abfb41bd6b;
  st[6] = 0x5be0cd19137e2179;
  if (data_len == 0) {
    local_3b8 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x0,x_00);
    FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,x_00);
    pFVar1 = FStar_UInt128_add(local_3b8,(uint128_t)in_stack_fffffffffffffa78,
                               (uint128_t)in_stack_fffffffffffffa88);
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)in_stack_fffffffffffffa78,(uint32_t)pFVar1,b,(uint64_t *)0x80)
    ;
  }
  else {
    uStack_1cc = data_len / 0x80;
    n_blocks_ = data_len % 0x80;
    if ((uStack_1cc != 0) && (n_blocks_ == 0)) {
      uStack_1cc = uStack_1cc - 1;
      n_blocks_ = data_len + uStack_1cc * -0x80;
    }
    Hacl_Hash_SHA2_sha512_update_nblocks(0x80,local_3a8,&stack0xffffffffffffff48);
    Hacl_Hash_SHA2_sha512_update_nblocks(uStack_1cc << 7,data,&stack0xffffffffffffff48);
    local_3d8 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,(uint64_t)data);
    local_3e0 = extraout_RDX;
    FStar_UInt128_uint64_to_uint128
              ((FStar_UInt128_uint128 *)(ulong)(uStack_1cc * 0x80),(uint64_t)data);
    local_3c8 = FStar_UInt128_add(local_3d8,(uint128_t)in_stack_fffffffffffffa78,
                                  (uint128_t)in_stack_fffffffffffffa88);
    FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)(ulong)n_blocks_,local_3e0);
    pFVar1 = FStar_UInt128_add(local_3c8,(uint128_t)in_stack_fffffffffffffa78,
                               (uint128_t)in_stack_fffffffffffffa88);
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)in_stack_fffffffffffffa78,(uint32_t)pFVar1,b_00,
               (uint64_t *)(ulong)n_blocks_);
  }
  Hacl_Hash_SHA2_sha512_finish(&stack0xffffffffffffff48,puVar2);
  puVar2 = local_3a8;
  Hacl_Hash_SHA2_sha512_init(&stack0xffffffffffffff48);
  scrut.snd = 0;
  scrut.fst = 0x40;
  n_blocks__1 = 0x40;
  uStack_2c4 = 0;
  n_blocks = 0x40;
  rem_len = 0;
  full_blocks_len = 0;
  local_2e0 = 0x40;
  full_blocks._4_4_ = 0;
  rem = puVar2;
  local_2f8 = puVar2;
  Hacl_Hash_SHA2_sha512_update_nblocks(0x80,local_3b0,&stack0xffffffffffffff48);
  puVar2 = rem;
  Hacl_Hash_SHA2_sha512_update_nblocks(full_blocks_len << 7,rem,&stack0xffffffffffffff48);
  local_3f8 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)0x80,(uint64_t)puVar2);
  local_400 = extraout_RDX_00;
  local_308 = local_3f8;
  local_318 = FStar_UInt128_uint64_to_uint128
                        ((FStar_UInt128_uint128 *)(ulong)full_blocks._4_4_,(uint64_t)puVar2);
  local_310 = extraout_RDX_01;
  local_320 = local_400;
  local_328 = local_3f8;
  local_330 = extraout_RDX_01;
  local_338 = local_318;
  local_3e8 = FStar_UInt128_add(local_3f8,(uint128_t)in_stack_fffffffffffffa78,
                                (uint128_t)in_stack_fffffffffffffa88);
  local_3f0 = extraout_RDX_02;
  local_348 = local_3e8;
  local_358 = FStar_UInt128_uint64_to_uint128((FStar_UInt128_uint128 *)(ulong)local_2e0,local_400);
  local_350 = extraout_RDX_03;
  local_360 = local_3f0;
  local_368 = local_3e8;
  local_370 = extraout_RDX_03;
  local_378 = local_358;
  local_388 = FStar_UInt128_add(local_3e8,(uint128_t)in_stack_fffffffffffffa78,
                                (uint128_t)in_stack_fffffffffffffa88);
  local_380 = b_01;
  local_390 = b_01;
  local_398 = local_388;
  Hacl_Hash_SHA2_sha512_update_last
            ((FStar_UInt128_uint128)in_stack_fffffffffffffa78,(uint32_t)local_388,b_01,
             (uint64_t *)(ulong)local_2e0);
  Hacl_Hash_SHA2_sha512_finish(&stack0xffffffffffffff48,dst);
  return;
}

Assistant:

void
EverCrypt_HMAC_compute_sha2_512(
  uint8_t *dst,
  uint8_t *key,
  uint32_t key_len,
  uint8_t *data,
  uint32_t data_len
)
{
  uint32_t l = 128U;
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t key_block[l];
  memset(key_block, 0U, l * sizeof (uint8_t));
  uint8_t *nkey = key_block;
  uint32_t ite;
  if (key_len <= 128U)
  {
    ite = key_len;
  }
  else
  {
    ite = 64U;
  }
  uint8_t *zeroes = key_block + ite;
  KRML_MAYBE_UNUSED_VAR(zeroes);
  if (key_len <= 128U)
  {
    memcpy(nkey, key, key_len * sizeof (uint8_t));
  }
  else
  {
    Hacl_Hash_SHA2_hash_512(nkey, key, key_len);
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t ipad[l];
  memset(ipad, 0x36U, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = ipad[i];
    uint8_t yi = key_block[i];
    ipad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t opad[l];
  memset(opad, 0x5cU, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = opad[i];
    uint8_t yi = key_block[i];
    opad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  uint64_t st[8U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t *os = st;
    uint64_t x = Hacl_Hash_SHA2_h512[i];
    os[i] = x;);
  uint64_t *s = st;
  uint8_t *dst1 = ipad;
  if (data_len == 0U)
  {
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(0ULL),
        FStar_UInt128_uint64_to_uint128((uint64_t)128U)),
      128U,
      ipad,
      s);
  }
  else
  {
    uint32_t block_len = 128U;
    uint32_t n_blocks0 = data_len / block_len;
    uint32_t rem0 = data_len % block_len;
    K___uint32_t_uint32_t scrut;
    if (n_blocks0 > 0U && rem0 == 0U)
    {
      uint32_t n_blocks_ = n_blocks0 - 1U;
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = data_len - n_blocks_ * block_len });
    }
    else
    {
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
    }
    uint32_t n_blocks = scrut.fst;
    uint32_t rem_len = scrut.snd;
    uint32_t full_blocks_len = n_blocks * block_len;
    uint8_t *full_blocks = data;
    uint8_t *rem = data + full_blocks_len;
    Hacl_Hash_SHA2_sha512_update_nblocks(128U, ipad, s);
    Hacl_Hash_SHA2_sha512_update_nblocks(n_blocks * 128U, full_blocks, s);
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
          FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
        FStar_UInt128_uint64_to_uint128((uint64_t)rem_len)),
      rem_len,
      rem,
      s);
  }
  Hacl_Hash_SHA2_sha512_finish(s, dst1);
  uint8_t *hash1 = ipad;
  Hacl_Hash_SHA2_sha512_init(s);
  uint32_t block_len = 128U;
  uint32_t n_blocks0 = 64U / block_len;
  uint32_t rem0 = 64U % block_len;
  K___uint32_t_uint32_t scrut;
  if (n_blocks0 > 0U && rem0 == 0U)
  {
    uint32_t n_blocks_ = n_blocks0 - 1U;
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = 64U - n_blocks_ * block_len });
  }
  else
  {
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
  }
  uint32_t n_blocks = scrut.fst;
  uint32_t rem_len = scrut.snd;
  uint32_t full_blocks_len = n_blocks * block_len;
  uint8_t *full_blocks = hash1;
  uint8_t *rem = hash1 + full_blocks_len;
  Hacl_Hash_SHA2_sha512_update_nblocks(128U, opad, s);
  Hacl_Hash_SHA2_sha512_update_nblocks(n_blocks * 128U, full_blocks, s);
  Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
        FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
      FStar_UInt128_uint64_to_uint128((uint64_t)rem_len)),
    rem_len,
    rem,
    s);
  Hacl_Hash_SHA2_sha512_finish(s, dst);
}